

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O0

wchar_t * nowide::basic_convert<wchar_t,char>
                    (wchar_t *buffer,size_t buffer_size,char *source_begin,char *source_end)

{
  code_point u;
  int iVar1;
  size_t width;
  wchar_t *pwStack_38;
  code_point c;
  wchar_t *rv;
  char *source_end_local;
  char *source_begin_local;
  size_t buffer_size_local;
  wchar_t *buffer_local;
  
  if (buffer_size == 0) {
    buffer_local = (wchar_t *)0x0;
  }
  else {
    source_begin_local = (char *)(buffer_size - 1);
    source_end_local = source_begin;
    buffer_size_local = (size_t)buffer;
    while (pwStack_38 = buffer, source_end_local != source_end) {
      u = utf::utf_traits<char,1>::decode<char_const*>(&source_end_local,source_end);
      if ((u == 0xffffffff) || (u == 0xfffffffe)) {
        pwStack_38 = (wchar_t *)0x0;
        break;
      }
      iVar1 = utf::utf_traits<wchar_t,_4>::width(u);
      if (source_begin_local < (char *)(long)iVar1) {
        pwStack_38 = (wchar_t *)0x0;
        break;
      }
      buffer_size_local =
           (size_t)utf::utf_traits<wchar_t,4>::encode<wchar_t*>(u,(wchar_t *)buffer_size_local);
      source_begin_local = source_begin_local + -(long)iVar1;
    }
    *(undefined4 *)buffer_size_local = 0;
    buffer_local = pwStack_38;
  }
  return buffer_local;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace nowide::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }